

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_striped_sse41_128_64.c
# Opt level: O2

parasail_result_t *
parasail_sw_stats_rowcol_striped_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  long *plVar1;
  undefined8 *puVar2;
  undefined4 *puVar3;
  undefined4 *puVar4;
  uint uVar5;
  void *pvVar6;
  parasail_matrix_t *ppVar7;
  void *pvVar8;
  void *pvVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined8 uVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  parasail_result_t *result;
  __m128i *palVar23;
  __m128i *palVar24;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *palVar25;
  __m128i *palVar26;
  longlong lVar27;
  size_t len;
  long lVar28;
  void *pvVar29;
  void *pvVar30;
  __m128i *palVar31;
  ulong uVar32;
  char *pcVar33;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  long lVar34;
  ulong uVar35;
  char *__format;
  ulong uVar36;
  int iVar37;
  int iVar38;
  __m128i *palVar39;
  longlong lVar40;
  ulong size;
  long lVar41;
  long lVar42;
  bool bVar43;
  ulong uVar44;
  ulong uVar45;
  long lVar46;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar47 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined1 auVar57 [16];
  undefined1 extraout_XMM0_01 [16];
  ulong uVar64;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 extraout_XMM0_02 [16];
  undefined1 extraout_XMM0_03 [16];
  undefined1 extraout_XMM0_04 [16];
  undefined1 auVar63 [16];
  longlong lVar65;
  __m128i_64_t B;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  longlong lVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  longlong lVar76;
  longlong lVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  longlong lVar82;
  long lVar83;
  ulong uVar84;
  longlong lVar87;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  long lVar88;
  longlong lVar92;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i c_05;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i b_07;
  __m128i b_08;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i alVar104;
  __m128i *local_2a0;
  __m128i *local_298;
  __m128i *local_290;
  __m128i *local_288;
  __m128i *local_280;
  undefined1 local_278 [16];
  __m128i *local_260;
  __m128i *local_258;
  __m128i *local_250;
  __m128i *local_248;
  __m128i *local_240;
  undefined1 local_238 [16];
  __m128i *local_228;
  __m128i *local_218;
  __m128i *local_210;
  undefined1 local_208 [16];
  ulong local_1f0;
  ulong local_1a0;
  undefined1 local_188 [16];
  long local_168;
  long lStack_160;
  longlong local_158;
  undefined1 local_128 [16];
  long local_118;
  long lStack_110;
  ulong uStack_e0;
  ulong uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar33 = "profile";
LAB_006debdf:
    fprintf(_stderr,__format,"parasail_sw_stats_rowcol_striped_profile_sse41_128_64",pcVar33);
    return (parasail_result_t *)0x0;
  }
  pvVar6 = (profile->profile64).score;
  if (pvVar6 == (void *)0x0) {
    __format = "%s: missing %s\n";
    pcVar33 = "profile->profile64.score";
    goto LAB_006debdf;
  }
  ppVar7 = profile->matrix;
  if (ppVar7 == (parasail_matrix_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar33 = "profile->matrix";
    goto LAB_006debdf;
  }
  uVar5 = profile->s1Len;
  uVar22 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    __format = "%s: %s must be > 0\n";
    pcVar33 = "profile->s1Len";
    goto LAB_006debdf;
  }
  if (s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar33 = "s2";
    goto LAB_006debdf;
  }
  local_1a0 = (ulong)(uint)s2Len;
  if (s2Len < 1) {
    __format = "%s: %s must be > 0\n";
    pcVar33 = "s2Len";
    goto LAB_006debdf;
  }
  if (open < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar33 = "open";
    goto LAB_006debdf;
  }
  if (gap < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar33 = "gap";
    goto LAB_006debdf;
  }
  size = uVar22 + 1 >> 1;
  uVar36 = (ulong)(uVar5 - 1) % size;
  pvVar8 = (profile->profile64).matches;
  pvVar9 = (profile->profile64).similar;
  iVar21 = ppVar7->max;
  result = parasail_result_new_rowcol3((uint)(uVar22 + 1) & 0x7ffffffe,s2Len);
  if (result == (parasail_result_t *)0x0) {
    return (parasail_result_t *)0x0;
  }
  result->flag = result->flag | 0x2850804;
  local_280 = parasail_memalign___m128i(0x10,size);
  local_258 = parasail_memalign___m128i(0x10,size);
  palVar23 = parasail_memalign___m128i(0x10,size);
  palVar24 = parasail_memalign___m128i(0x10,size);
  local_240 = parasail_memalign___m128i(0x10,size);
  local_2a0 = parasail_memalign___m128i(0x10,size);
  local_248 = parasail_memalign___m128i(0x10,size);
  local_228 = parasail_memalign___m128i(0x10,size);
  b = parasail_memalign___m128i(0x10,size);
  b_00 = parasail_memalign___m128i(0x10,size);
  b_01 = parasail_memalign___m128i(0x10,size);
  b_02 = parasail_memalign___m128i(0x10,size);
  local_260 = parasail_memalign___m128i(0x10,size);
  local_210 = parasail_memalign___m128i(0x10,size);
  local_250 = parasail_memalign___m128i(0x10,size);
  local_218 = parasail_memalign___m128i(0x10,size);
  auVar47._0_8_ = -(ulong)(local_280 == (__m128i *)0x0);
  auVar47._8_8_ = -(ulong)(local_258 == (__m128i *)0x0);
  auVar81._0_8_ = -(ulong)(palVar23 == (__m128i *)0x0);
  auVar81._8_8_ = -(ulong)(palVar24 == (__m128i *)0x0);
  auVar47 = packssdw(auVar47,auVar81);
  auVar78._0_8_ = -(ulong)(local_240 == (__m128i *)0x0);
  auVar78._8_8_ = -(ulong)(local_2a0 == (__m128i *)0x0);
  auVar95._0_8_ = -(ulong)(local_248 == (__m128i *)0x0);
  auVar95._8_8_ = -(ulong)(local_228 == (__m128i *)0x0);
  auVar71 = packssdw(auVar78,auVar95);
  auVar47 = packssdw(auVar47,auVar71);
  auVar71._0_8_ = -(ulong)(b == (__m128i *)0x0);
  auVar71._8_8_ = -(ulong)(b_00 == (__m128i *)0x0);
  auVar96._0_8_ = -(ulong)(b_01 == (__m128i *)0x0);
  auVar96._8_8_ = -(ulong)(b_02 == (__m128i *)0x0);
  auVar71 = packssdw(auVar71,auVar96);
  auVar74._0_8_ = -(ulong)(local_260 == (__m128i *)0x0);
  auVar74._8_8_ = -(ulong)(local_210 == (__m128i *)0x0);
  auVar94._0_8_ = -(ulong)(local_250 == (__m128i *)0x0);
  auVar94._8_8_ = -(ulong)(local_218 == (__m128i *)0x0);
  auVar78 = packssdw(auVar74,auVar94);
  auVar71 = packssdw(auVar71,auVar78);
  auVar47 = packsswb(auVar47,auVar71);
  if ((((((((((((((((auVar47 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar47 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar47 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar47 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar47 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar47 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar47 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar47 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar47 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar47 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar47 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar47 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar47 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       (auVar47 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar47 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar47[0xf] < '\0') {
    return (parasail_result_t *)0x0;
  }
  local_1f0 = 0;
  len = 0x7fffffffffffffff;
  uVar18 = 1 - (int)((uVar5 - 1) / size);
  uVar44 = (ulong)(uint)gap;
  alVar104[1] = (longlong)palVar24;
  alVar104[0] = size;
  parasail_memset___m128i(local_280,alVar104,0x7fffffffffffffff);
  c[1] = extraout_RDX;
  c[0] = size;
  parasail_memset___m128i(palVar23,c,len);
  c_00[1] = extraout_RDX_00;
  c_00[0] = size;
  parasail_memset___m128i(local_240,c_00,len);
  c_01[1] = extraout_RDX_01;
  c_01[0] = size;
  parasail_memset___m128i(local_248,c_01,len);
  c_02[1] = extraout_RDX_02;
  c_02[0] = size;
  parasail_memset___m128i(b,c_02,len);
  c_03[1] = extraout_RDX_03;
  c_03[0] = size;
  parasail_memset___m128i(b_00,c_03,len);
  c_04[1] = extraout_RDX_04;
  c_04[0] = size;
  parasail_memset___m128i(b_01,c_04,len);
  pmovsxbq(extraout_XMM0,0x101);
  c_05[1] = extraout_RDX_05;
  c_05[0] = size;
  parasail_memset___m128i(b_02,c_05,len);
  uVar5 = (uint)size;
  uVar19 = uVar5 - 1;
  local_238 = (undefined1  [16])0x0;
  local_208 = (undefined1  [16])0x0;
  local_158 = 0;
  lVar34 = -0x4000000000000000;
  for (uVar32 = 0; palVar39 = local_280, uVar32 != local_1a0; uVar32 = uVar32 + 1) {
    lVar40 = palVar39[uVar19][0];
    lVar27 = palVar23[uVar19][0];
    lVar92 = local_240[uVar19][0];
    lVar87 = local_248[uVar19][0];
    lVar28 = (long)(int)(ppVar7->mapper[(byte)s2[uVar32]] * uVar5) * 0x10;
    pvVar29 = (void *)(lVar28 + (long)pvVar9);
    iVar20 = (int)uVar32 + -2;
    bVar43 = (int)local_1f0 == iVar20;
    palVar25 = local_218;
    if (bVar43) {
      palVar25 = local_228;
    }
    lVar46 = 0;
    palVar26 = local_210;
    if (bVar43) {
      palVar26 = palVar24;
    }
    lVar42 = 0;
    local_298 = local_228;
    if (bVar43) {
      local_298 = local_218;
    }
    lVar88 = 0;
    local_290 = local_2a0;
    if (bVar43) {
      local_290 = local_250;
    }
    lVar83 = 0;
    local_280 = local_258;
    local_288 = palVar24;
    if (bVar43) {
      local_280 = local_260;
      local_288 = local_210;
    }
    auVar47 = ZEXT816(0);
    local_278 = (undefined1  [16])0x0;
    lVar41 = 0;
    auVar71 = ZEXT816(0);
    pvVar30 = pvVar29;
    uVar35 = uVar32;
    auVar99 = _DAT_008a1f70;
    while( true ) {
      uStack_60 = (ulong)(uint)open;
      uStack_e0 = (ulong)(uint)gap;
      if (size << 4 == lVar41) break;
      auVar78 = *(undefined1 (*) [16])((long)*b + lVar41);
      auVar74 = *(undefined1 (*) [16])((long)*b_00 + lVar41);
      plVar1 = (long *)((long)pvVar6 + lVar41 + lVar28);
      auVar48._0_8_ = lVar46 + *plVar1;
      auVar48._8_8_ = lVar40 + plVar1[1];
      auVar81 = *(undefined1 (*) [16])((long)*b_01 + lVar41);
      auVar72._0_8_ = -(ulong)(0 < auVar48._0_8_);
      auVar72._8_8_ = -(ulong)(0 < auVar48._8_8_);
      auVar72 = auVar72 & auVar48;
      auVar49._0_8_ = -(ulong)(auVar78._0_8_ < auVar72._0_8_);
      auVar49._8_8_ = -(ulong)(auVar78._8_8_ < auVar72._8_8_);
      auVar95 = blendvpd(auVar78,auVar72,auVar49);
      auVar79._0_8_ = -(ulong)(local_278._0_8_ < auVar95._0_8_);
      auVar79._8_8_ = -(ulong)(local_278._8_8_ < auVar95._8_8_);
      auVar102 = blendvpd(local_278,auVar95,auVar79);
      auVar95 = *(undefined1 (*) [16])((long)*b_02 + lVar41);
      *(undefined1 (*) [16])((long)*local_280 + lVar41) = auVar102;
      auVar96 = blendvpd(auVar47,auVar74,auVar79);
      plVar1 = (long *)((long)pvVar8 + lVar41 + lVar28);
      auVar93._0_8_ = lVar42 + *plVar1;
      auVar93._8_8_ = lVar27 + plVar1[1];
      lVar46 = auVar102._0_8_;
      auVar73._0_8_ = -(ulong)(auVar72._0_8_ == lVar46);
      lVar42 = auVar102._8_8_;
      auVar73._8_8_ = -(ulong)(auVar72._8_8_ == lVar42);
      auVar97 = blendvpd(auVar96,auVar93,auVar73);
      auVar50._0_8_ = -(ulong)(lVar46 == 0);
      auVar50._8_8_ = -(ulong)(lVar42 == 0);
      auVar97 = ~auVar50 & auVar97;
      *(undefined1 (*) [16])((long)*local_288 + lVar41) = auVar97;
      auVar96 = blendvpd(auVar71,auVar81,auVar79);
      plVar1 = (long *)((long)pvVar29 + lVar41);
      auVar89._0_8_ = lVar88 + *plVar1;
      auVar89._8_8_ = lVar92 + plVar1[1];
      auVar94 = blendvpd(auVar96,auVar89,auVar73);
      auVar96 = blendvpd(auVar99,auVar95,auVar79);
      auVar51._8_4_ = 0xffffffff;
      auVar51._0_8_ = 0xffffffffffffffff;
      auVar51._12_4_ = 0xffffffff;
      auVar85._0_8_ = lVar83 + 1;
      auVar85._8_8_ = lVar87 - auVar51._8_8_;
      auVar90 = blendvpd(auVar96,auVar85,auVar73);
      auVar94 = ~auVar50 & auVar94;
      auVar90 = ~auVar50 & auVar90;
      auVar52._0_8_ = -(ulong)(auVar97._0_8_ < local_208._0_8_);
      auVar52._8_8_ = -(ulong)(auVar97._8_8_ < local_208._8_8_);
      auVar96 = blendvpd(auVar97,local_208,auVar52);
      auVar53._0_8_ = -(ulong)(auVar94._0_8_ < auVar96._0_8_);
      auVar53._8_8_ = -(ulong)(auVar94._8_8_ < auVar96._8_8_);
      auVar96 = blendvpd(auVar94,auVar96,auVar53);
      auVar54._0_8_ = -(ulong)(auVar90._0_8_ < auVar96._0_8_);
      auVar54._8_8_ = -(ulong)(auVar90._8_8_ < auVar96._8_8_);
      local_208 = blendvpd(auVar90,auVar96,auVar54);
      auVar55._0_8_ = -(ulong)(local_238._0_8_ < lVar46);
      auVar55._8_8_ = -(ulong)(local_238._8_8_ < lVar42);
      local_238 = blendvpd(local_238,auVar102,auVar55);
      auVar103._0_8_ = lVar46 - (ulong)(uint)open;
      auVar103._8_8_ = lVar42 - uStack_60;
      auVar66._0_8_ = auVar78._0_8_ - uVar44;
      auVar66._8_8_ = auVar78._8_8_ - uStack_e0;
      auVar56._0_8_ = -(ulong)(auVar66._0_8_ < auVar103._0_8_);
      auVar56._8_8_ = -(ulong)(auVar66._8_8_ < auVar103._8_8_);
      auVar96 = blendvpd(auVar66,auVar103,auVar56);
      *(undefined1 (*) [16])((long)*local_290 + lVar41) = auVar94;
      *(undefined1 (*) [16])((long)*local_298 + lVar41) = auVar90;
      b_03[1] = (longlong)pvVar30;
      b_03[0] = (longlong)palVar24;
      a[1] = uVar35;
      a[0] = (longlong)local_228;
      alVar104 = _mm_cmpgt_epi64_rpl(a,b_03);
      b_04[0] = alVar104[1];
      auVar78 = pblendvb(auVar74,auVar97,extraout_XMM0_00);
      auVar74 = pblendvb(auVar81,auVar94,extraout_XMM0_00);
      local_118 = auVar95._0_8_;
      lStack_110 = auVar95._8_8_;
      auVar86._8_4_ = 0xffffffff;
      auVar86._0_8_ = 0xffffffffffffffff;
      auVar86._12_4_ = 0xffffffff;
      auVar80._0_8_ = local_118 + 1;
      auVar80._8_8_ = lStack_110 - auVar86._8_8_;
      auVar91._0_8_ = auVar90._0_8_ + 1;
      auVar91._8_8_ = auVar90._8_8_ - auVar86._8_8_;
      auVar81 = pblendvb(auVar80,auVar91,extraout_XMM0_00);
      local_58 = auVar96._0_8_;
      uStack_50 = auVar96._8_8_;
      puVar2 = (undefined8 *)((long)*b + lVar41);
      *puVar2 = local_58;
      puVar2[1] = uStack_50;
      *(undefined1 (*) [16])((long)*b_00 + lVar41) = auVar78;
      *(undefined1 (*) [16])((long)*b_01 + lVar41) = auVar74;
      *(undefined1 (*) [16])((long)*b_02 + lVar41) = auVar81;
      auVar67._0_8_ = local_278._0_8_ - uVar44;
      auVar67._8_8_ = local_278._8_8_ - uStack_e0;
      auVar57._0_8_ = -(ulong)(auVar67._0_8_ < auVar103._0_8_);
      auVar57._8_8_ = -(ulong)(auVar67._8_8_ < auVar103._8_8_);
      local_278 = blendvpd(auVar67,auVar103,auVar57);
      b_04[1] = (longlong)pvVar30;
      a_00[1] = uVar35;
      a_00[0] = (longlong)local_228;
      alVar104 = _mm_cmpgt_epi64_rpl(a_00,b_04);
      palVar24 = alVar104[1];
      local_168 = auVar99._0_8_;
      lStack_160 = auVar99._8_8_;
      auVar47 = pblendvb(auVar47,auVar97,extraout_XMM0_01);
      auVar71 = pblendvb(auVar71,auVar94,extraout_XMM0_01);
      auVar98._0_8_ = local_168 + 1;
      auVar98._8_8_ = lStack_160 + 1;
      auVar99 = pblendvb(auVar98,auVar91,extraout_XMM0_01);
      plVar1 = (long *)((long)*palVar39 + lVar41);
      lVar46 = *plVar1;
      lVar40 = plVar1[1];
      plVar1 = (long *)((long)*palVar23 + lVar41);
      lVar42 = *plVar1;
      lVar27 = plVar1[1];
      plVar1 = (long *)((long)*local_240 + lVar41);
      lVar88 = *plVar1;
      lVar92 = plVar1[1];
      plVar1 = (long *)((long)*local_248 + lVar41);
      lVar83 = *plVar1;
      lVar87 = plVar1[1];
      lVar41 = lVar41 + 0x10;
    }
    if ((int)local_1f0 == iVar20) {
      local_260 = local_258;
      local_250 = local_2a0;
    }
    palVar31 = local_250;
    for (iVar20 = 0; iVar20 != 2; iVar20 = iVar20 + 1) {
      lVar40 = palVar39[uVar19][0];
      lVar46 = 0;
      auVar101._0_8_ = local_278._0_8_;
      auVar101._8_4_ = local_278._0_4_;
      auVar101._12_4_ = local_278._4_4_;
      local_278._8_8_ = auVar101._8_8_;
      local_278._0_8_ = (long)-open;
      auVar90._8_8_ = 0;
      auVar90._0_8_ = auVar47._0_8_;
      auVar47 = auVar90 << 0x40;
      auVar97._8_8_ = 0;
      auVar97._0_8_ = auVar71._0_8_;
      auVar71 = auVar97 << 0x40;
      auVar102._0_8_ = auVar99._0_8_;
      auVar102._8_4_ = auVar99._0_4_;
      auVar102._12_4_ = auVar99._4_4_;
      auVar99._8_8_ = auVar102._8_8_;
      auVar99._0_8_ = 1;
      for (lVar42 = 0; size << 4 != lVar42; lVar42 = lVar42 + 0x10) {
        plVar1 = (long *)((long)pvVar6 + lVar42 + lVar28);
        uVar45 = lVar46 + *plVar1;
        uVar64 = lVar40 + plVar1[1];
        auVar78 = *(undefined1 (*) [16])((long)*local_280 + lVar42);
        auVar58._0_8_ = -(ulong)(local_278._0_8_ < auVar78._0_8_);
        auVar58._8_8_ = -(ulong)(local_278._8_8_ < auVar78._8_8_);
        auVar81 = blendvpd(local_278,auVar78,auVar58);
        *(undefined1 (*) [16])((long)*local_280 + lVar42) = auVar81;
        uVar84 = auVar81._0_8_;
        auVar68._0_8_ = -(ulong)((-(ulong)(0 < (long)uVar45) & uVar45) == uVar84);
        uVar45 = auVar81._8_8_;
        auVar68._8_8_ = -(ulong)((-(ulong)(0 < (long)uVar64) & uVar64) == uVar45);
        auVar68 = auVar68 | auVar58;
        auVar74 = blendvpd(auVar47,*(undefined1 (*) [16])((long)*local_288 + lVar42),auVar68);
        *(undefined1 (*) [16])((long)*local_288 + lVar42) = auVar74;
        auVar96 = blendvpd(auVar71,*(undefined1 (*) [16])((long)*local_290 + lVar42),auVar68);
        *(undefined1 (*) [16])((long)*local_290 + lVar42) = auVar96;
        auVar95 = blendvpd(auVar99,*(undefined1 (*) [16])((long)*local_298 + lVar42),auVar68);
        auVar59._0_8_ = -(ulong)(auVar74._0_8_ < local_208._0_8_);
        auVar59._8_8_ = -(ulong)(auVar74._8_8_ < local_208._8_8_);
        auVar78 = blendvpd(auVar74,local_208,auVar59);
        auVar60._0_8_ = -(ulong)(auVar96._0_8_ < auVar78._0_8_);
        auVar60._8_8_ = -(ulong)(auVar96._8_8_ < auVar78._8_8_);
        auVar78 = blendvpd(auVar96,auVar78,auVar60);
        auVar61._0_8_ = -(ulong)(auVar95._0_8_ < auVar78._0_8_);
        auVar61._8_8_ = -(ulong)(auVar95._8_8_ < auVar78._8_8_);
        local_208 = blendvpd(auVar95,auVar78,auVar61);
        *(undefined1 (*) [16])((long)*local_298 + lVar42) = auVar95;
        auVar62._0_8_ = -(ulong)(local_238._0_8_ < (long)uVar84);
        auVar62._8_8_ = -(ulong)(local_238._8_8_ < (long)uVar45);
        local_238 = blendvpd(local_238,auVar81,auVar62);
        lVar46 = local_278._0_8_ - uVar44;
        local_278._8_8_ = local_278._8_8_ - uStack_e0;
        local_278._0_8_ = lVar46;
        b_05[1] = (longlong)palVar31;
        b_05[0] = (longlong)palVar24;
        a_01[1] = uVar35;
        a_01[0] = (longlong)local_228;
        alVar104 = _mm_cmpgt_epi64_rpl(a_01,b_05);
        b_06[0] = alVar104[1];
        local_188._8_8_ = extraout_XMM0_Qb;
        local_188._0_8_ = extraout_XMM0_Qa;
        local_128._8_8_ = -(ulong)(local_278._8_8_ == uVar45 - uStack_60);
        local_128._0_8_ = -(ulong)(lVar46 == uVar84 - (uint)open);
        b_06[1] = (longlong)palVar31;
        a_02[1] = uVar35;
        a_02[0] = (longlong)local_228;
        alVar104 = _mm_cmpgt_epi64_rpl(a_02,b_06);
        b_07[0] = alVar104[1];
        local_188 = extraout_XMM0_02 & local_128 | local_188;
        if ((((((((((((((((local_188 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (local_188 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (local_188 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (local_188 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (local_188 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (local_188 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (local_188 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (local_188 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (local_188 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (local_188 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (local_188 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (local_188 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (local_188 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (local_188 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (local_188 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            -1 < local_188[0xf]) goto LAB_006de73d;
        b_07[1] = (longlong)palVar31;
        a_03[1] = uVar35;
        a_03[0] = (longlong)local_228;
        alVar104 = _mm_cmpgt_epi64_rpl(a_03,b_07);
        palVar24 = alVar104[1];
        auVar47 = pblendvb(auVar47,auVar74,extraout_XMM0_03);
        auVar71 = pblendvb(auVar71,auVar96,extraout_XMM0_03);
        auVar69._8_4_ = 0xffffffff;
        auVar69._0_8_ = 0xffffffffffffffff;
        auVar69._12_4_ = 0xffffffff;
        local_168 = auVar99._0_8_;
        lStack_160 = auVar99._8_8_;
        auVar100._0_8_ = local_168 + 1;
        auVar100._8_8_ = lStack_160 - auVar69._8_8_;
        auVar75._0_8_ = auVar95._0_8_ + 1;
        auVar75._8_8_ = auVar95._8_8_ - auVar69._8_8_;
        auVar99 = pblendvb(auVar100,auVar75,extraout_XMM0_03);
        plVar1 = (long *)((long)*palVar39 + lVar42);
        lVar46 = *plVar1;
        lVar40 = plVar1[1];
      }
    }
LAB_006de73d:
    b_08[0] = (ulong)uVar18;
    iVar20 = 0;
    lVar40 = local_298[uVar36][0];
    lVar27 = local_298[uVar36][1];
    lVar92 = local_290[uVar36][0];
    lVar87 = local_290[uVar36][1];
    lVar65 = local_288[uVar36][0];
    lVar76 = local_288[uVar36][1];
    lVar70 = local_280[uVar36][0];
    lVar82 = local_280[uVar36][1];
    while (lVar77 = lVar70, lVar70 = lVar65, lVar65 = lVar92, lVar92 = lVar40, iVar20 < (int)uVar18)
    {
      lVar40 = 0;
      lVar27 = lVar92;
      lVar92 = 0;
      lVar87 = lVar65;
      lVar65 = 0;
      lVar76 = lVar70;
      lVar70 = 0;
      lVar82 = lVar77;
      iVar20 = 1;
    }
    *(int *)(*((result->field_4).trace)->trace_del_table + uVar32 * 4) = (int)lVar82;
    *(int *)(*(long *)((long)((result->field_4).trace)->trace_del_table + 8) + uVar32 * 4) =
         (int)lVar76;
    *(int *)(*(long *)((long)((result->field_4).trace)->trace_del_table + 0x10) + uVar32 * 4) =
         (int)lVar87;
    *(int *)(*(long *)((long)((result->field_4).trace)->trace_del_table + 0x18) + uVar32 * 4) =
         (int)lVar27;
    b_08[1] = uVar32;
    a_04[1] = uVar35;
    a_04[0] = (longlong)local_228;
    _mm_cmpgt_epi64_rpl(a_04,b_08);
    local_228 = local_248;
    local_210 = palVar26;
    local_218 = palVar25;
    local_258 = palVar39;
    if ((((((((((((((((extraout_XMM0_04 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (extraout_XMM0_04 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (extraout_XMM0_04 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (extraout_XMM0_04 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (extraout_XMM0_04 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (extraout_XMM0_04 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (extraout_XMM0_04 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (extraout_XMM0_04 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (extraout_XMM0_04 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (extraout_XMM0_04 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (extraout_XMM0_04 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (extraout_XMM0_04 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (extraout_XMM0_04 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (extraout_XMM0_04 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (extraout_XMM0_04 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        extraout_XMM0_04[0xf] < '\0') {
      lVar34 = local_238._8_8_;
      if ((long)local_238._8_8_ < (long)local_238._0_8_) {
        lVar34 = local_238._0_8_;
      }
      if ((long)(~(long)iVar21 + 0x7fffffffffffffffU) < lVar34) {
        *(byte *)&result->flag = (byte)result->flag | 0x40;
        local_2a0 = local_240;
        local_1a0 = uVar32;
        local_278._0_8_ = palVar23;
        goto LAB_006de968;
      }
      local_1f0 = uVar32 & 0xffffffff;
    }
    local_2a0 = local_240;
    palVar24 = palVar23;
    palVar23 = local_288;
    local_248 = local_298;
    local_240 = local_290;
  }
  local_298 = local_248;
  local_290 = local_240;
  local_288 = palVar23;
  local_280 = palVar39;
  local_278._0_8_ = palVar24;
LAB_006de968:
  palVar26 = local_258;
  uVar17 = local_278._0_8_;
  palVar25 = local_280;
  palVar39 = local_288;
  palVar23 = local_290;
  palVar24 = local_298;
  lVar28 = size * 4;
  for (lVar46 = 0; lVar28 != lVar46; lVar46 = lVar46 + 4) {
    puVar3 = (undefined4 *)((long)*local_280 + lVar46 * 4);
    uVar10 = puVar3[2];
    puVar4 = (undefined4 *)((long)*local_288 + lVar46 * 4);
    uVar11 = *puVar4;
    uVar12 = puVar4[2];
    puVar4 = (undefined4 *)((long)*local_290 + lVar46 * 4);
    uVar13 = *puVar4;
    uVar14 = puVar4[2];
    puVar4 = (undefined4 *)((long)*local_298 + lVar46 * 4);
    uVar15 = *puVar4;
    uVar16 = puVar4[2];
    lVar42 = *(long *)((long)((result->field_4).trace)->trace_del_table + 0x20);
    *(undefined4 *)(lVar42 + lVar46) = *puVar3;
    *(undefined4 *)(lVar28 + lVar42 + lVar46) = uVar10;
    lVar42 = *(long *)((long)((result->field_4).trace)->trace_del_table + 0x28);
    *(undefined4 *)(lVar42 + lVar46) = uVar11;
    *(undefined4 *)(lVar28 + lVar42 + lVar46) = uVar12;
    lVar42 = *(long *)((long)((result->field_4).trace)->trace_del_table + 0x30);
    *(undefined4 *)(lVar42 + lVar46) = uVar13;
    *(undefined4 *)(lVar28 + lVar42 + lVar46) = uVar14;
    lVar42 = *(long *)((long)((result->field_4).trace)->trace_del_table + 0x38);
    *(undefined4 *)(lVar42 + lVar46) = uVar15;
    *(undefined4 *)(lVar28 + lVar42 + lVar46) = uVar16;
  }
  if (lVar34 != 0x7fffffffffffffff) {
    auVar63._0_8_ = -(ulong)(local_208._0_8_ == 0x7fffffffffffffff);
    auVar63._8_8_ = -(ulong)(local_208._8_8_ == 0x7fffffffffffffff);
    iVar21 = movmskpd(0xffffffff,auVar63);
    if (iVar21 == 0) goto LAB_006dea54;
  }
  *(byte *)&result->flag = (byte)result->flag | 0x40;
LAB_006dea54:
  iVar21 = parasail_result_is_saturated(result);
  iVar20 = 0;
  if (iVar21 == 0) {
    palVar31 = local_2a0;
    if ((int)local_1f0 == (int)local_1a0 + -1) {
      local_298 = local_218;
      local_290 = local_250;
      local_288 = local_210;
      local_280 = local_260;
      local_260 = palVar25;
      local_210 = palVar39;
      local_250 = palVar23;
    }
    else {
      palVar24 = local_218;
      if ((int)local_1f0 == (int)local_1a0 + -2) {
        local_278._0_8_ = local_210;
        local_258 = local_260;
        local_260 = palVar26;
        local_210 = (__m128i *)uVar17;
        palVar31 = local_250;
        local_250 = local_2a0;
        palVar24 = local_228;
        local_228 = local_218;
      }
    }
    local_218 = palVar24;
    uVar36 = 0;
    lVar40 = 0;
    lVar27 = 0;
    while( true ) {
      iVar21 = (int)lVar27;
      iVar38 = (int)lVar40;
      iVar37 = (int)uVar22;
      if ((uVar5 & 0x3fffffff) * 2 == (int)uVar36) break;
      if ((*local_260)[uVar36] == lVar34) {
        uVar18 = 0;
        if ((uVar36 & 1) != 0) {
          uVar18 = uVar5;
        }
        uVar18 = uVar18 + ((uint)(uVar36 >> 1) & 0x7fffffff);
        if ((int)uVar18 < iVar37) {
          lVar40 = (*local_210)[uVar36];
          lVar27 = (*local_250)[uVar36];
          local_158 = (*local_218)[uVar36];
          uVar22 = (ulong)uVar18;
        }
      }
      uVar36 = uVar36 + 1;
    }
    iVar20 = (int)local_158;
    local_2a0 = palVar31;
  }
  else {
    iVar21 = 0;
    iVar38 = 0;
    lVar34 = 0;
    local_1f0._0_4_ = 0;
    iVar37 = 0;
  }
  result->score = (int)lVar34;
  result->end_query = iVar37;
  result->end_ref = (int)local_1f0;
  ((result->field_4).stats)->matches = iVar38;
  ((result->field_4).stats)->similar = iVar21;
  ((result->field_4).stats)->length = iVar20;
  parasail_free(local_218);
  parasail_free(local_250);
  parasail_free(local_210);
  parasail_free(local_260);
  parasail_free(b_02);
  parasail_free(b_01);
  parasail_free(b_00);
  parasail_free(b);
  parasail_free(local_228);
  parasail_free(local_298);
  parasail_free(local_2a0);
  parasail_free(local_290);
  parasail_free((void *)local_278._0_8_);
  parasail_free(local_288);
  parasail_free(local_258);
  parasail_free(local_280);
  return result;
}

Assistant:

STATIC parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMStore = NULL;
    __m128i* restrict pvHMLoad = NULL;
    __m128i* restrict pvHSStore = NULL;
    __m128i* restrict pvHSLoad = NULL;
    __m128i* restrict pvHLStore = NULL;
    __m128i* restrict pvHLLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i vGapO;
    __m128i vGapE;
    __m128i vZero;
    __m128i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    __m128i vSaturationCheckMax;
    __m128i vPosLimit;
    int64_t maxp = 0;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile  = (__m128i*)profile->profile64.score;
    vProfileM = (__m128i*)profile->profile64.matches;
    vProfileS = (__m128i*)profile->profile64.similar;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi64x_rpl(1);
    score = NEG_INF;
    matches = NEG_INF;
    similar = NEG_INF;
    length = NEG_INF;
    vMaxH = vZero;
    vMaxHUnit = vZero;
    vSaturationCheckMax = vZero;
    vPosLimit = _mm_set1_epi64x_rpl(INT64_MAX);
    maxp = INT64_MAX - (int64_t)(matrix->max+1);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m128i(16, segLen);
    pvHLoad   = parasail_memalign___m128i(16, segLen);
    pvHMStore = parasail_memalign___m128i(16, segLen);
    pvHMLoad  = parasail_memalign___m128i(16, segLen);
    pvHSStore = parasail_memalign___m128i(16, segLen);
    pvHSLoad  = parasail_memalign___m128i(16, segLen);
    pvHLStore = parasail_memalign___m128i(16, segLen);
    pvHLLoad  = parasail_memalign___m128i(16, segLen);
    pvE       = parasail_memalign___m128i(16, segLen);
    pvEM      = parasail_memalign___m128i(16, segLen);
    pvES      = parasail_memalign___m128i(16, segLen);
    pvEL      = parasail_memalign___m128i(16, segLen);
    pvHMax    = parasail_memalign___m128i(16, segLen);
    pvHMMax   = parasail_memalign___m128i(16, segLen);
    pvHSMax   = parasail_memalign___m128i(16, segLen);
    pvHLMax   = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;

    parasail_memset___m128i(pvHStore, vZero, segLen);
    parasail_memset___m128i(pvHMStore, vZero, segLen);
    parasail_memset___m128i(pvHSStore, vZero, segLen);
    parasail_memset___m128i(pvHLStore, vZero, segLen);
    parasail_memset___m128i(pvE, _mm_set1_epi64x_rpl(-open), segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vOne, segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vH_dag;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        const __m128i* vP = NULL;
        const __m128i* vPM = NULL;
        const __m128i* vPS = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vZero;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 8 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vHM = _mm_load_si128(&pvHMStore[segLen - 1]);
        vHS = _mm_load_si128(&pvHSStore[segLen - 1]);
        vHL = _mm_load_si128(&pvHLStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 8);
        vHM = _mm_slli_si128(vHM, 8);
        vHS = _mm_slli_si128(vHS, 8);
        vHL = _mm_slli_si128(vHL, 8);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            SWAP3(pvHMax,  pvHLoad,  pvHStore)
            SWAP3(pvHMMax, pvHMLoad, pvHMStore)
            SWAP3(pvHSMax, pvHSLoad, pvHSStore)
            SWAP3(pvHLMax, pvHLLoad, pvHLStore)
        }
        else {
            /* Swap the 2 H buffers. */
            SWAP(pvHLoad,  pvHStore)
            SWAP(pvHMLoad, pvHMStore)
            SWAP(pvHSLoad, pvHSStore)
            SWAP(pvHLLoad, pvHLStore)
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m128i cond_zero;
            __m128i case1;
            __m128i case2;

            vE = _mm_load_si128(pvE+ i);
            vEM = _mm_load_si128(pvEM+ i);
            vES = _mm_load_si128(pvES+ i);
            vEL = _mm_load_si128(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_add_epi64(vH, _mm_load_si128(vP + i));
            vH_dag = _mm_max_epi64_rpl(vH_dag, vZero);
            vH = _mm_max_epi64_rpl(vH_dag, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            cond_zero = _mm_cmpeq_epi64(vH, vZero);

            case1 = _mm_cmpeq_epi64(vH, vH_dag);
            case2 = _mm_cmpeq_epi64(vH, vF);

            /* calculate vM */
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_add_epi64(vHM, _mm_load_si128(vPM + i)), case1);
            vHM = _mm_andnot_si128(cond_zero, vHM);
            _mm_store_si128(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_add_epi64(vHS, _mm_load_si128(vPS + i)), case1);
            vHS = _mm_andnot_si128(cond_zero, vHS);
            _mm_store_si128(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_add_epi64(vHL, vOne), case1);
            vHL = _mm_andnot_si128(cond_zero, vHL);
            _mm_store_si128(pvHLStore + i, vHL);

            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm_max_epi64_rpl(vH, vMaxH);
            vEF_opn = _mm_sub_epi64(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_sub_epi64(vE, vGapE);
            vE = _mm_max_epi64_rpl(vEF_opn, vE_ext);
            case1 = _mm_cmpgt_epi64_rpl(vEF_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(
                    _mm_add_epi64(vEL, vOne),
                    _mm_add_epi64(vHL, vOne),
                    case1);
            _mm_store_si128(pvE + i, vE);
            _mm_store_si128(pvEM + i, vEM);
            _mm_store_si128(pvES + i, vES);
            _mm_store_si128(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vEF_opn, vF_ext);
            case1 = _mm_cmpgt_epi64_rpl(vEF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi64(vFL, vOne),
                    _mm_add_epi64(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
            vHM = _mm_load_si128(pvHMLoad + i);
            vHS = _mm_load_si128(pvHSLoad + i);
            vHL = _mm_load_si128(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            vHp = _mm_slli_si128(vHp, 8);
            vF = _mm_slli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, -open, 0);
            vFM = _mm_slli_si128(vFM, 8);
            vFS = _mm_slli_si128(vFS, 8);
            vFL = _mm_slli_si128(vFL, 8);
            vFL = _mm_insert_epi64_rpl(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m128i case1;
                __m128i case2;
                __m128i cond;

                vHp = _mm_add_epi64(vHp, _mm_load_si128(vP + i));
                vHp = _mm_max_epi64_rpl(vHp, vZero);
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi64_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                case1 = _mm_cmpeq_epi64(vH, vHp);
                case2 = _mm_cmpeq_epi64(vH, vF);
                cond = _mm_andnot_si128(case1, case2);

                /* calculate vM */
                vHM = _mm_load_si128(pvHMStore + i);
                vHM = _mm_blendv_epi8(vHM, vFM, cond);
                _mm_store_si128(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm_load_si128(pvHSStore + i);
                vHS = _mm_blendv_epi8(vHS, vFS, cond);
                _mm_store_si128(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm_load_si128(pvHLStore + i);
                vHL = _mm_blendv_epi8(vHL, vFL, cond);
                _mm_store_si128(pvHLStore + i, vHL);

                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vMaxH = _mm_max_epi64_rpl(vH, vMaxH);
                /* Update vF value. */
                vEF_opn = _mm_sub_epi64(vH, vGapO);
                vF_ext = _mm_sub_epi64(vF, vGapE);
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi64_rpl(vF_ext, vEF_opn),
                                _mm_and_si128(
                                    _mm_cmpeq_epi64(vF_ext, vEF_opn),
                                    _mm_cmpgt_epi64_rpl(vF_ext, vZero)))))
                    goto end;
                /*vF = _mm_max_epi64_rpl(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm_cmpgt_epi64_rpl(vEF_opn, vF_ext);
                vFM = _mm_blendv_epi8(vFM, vHM, cond);
                vFS = _mm_blendv_epi8(vFS, vHS, cond);
                vFL = _mm_blendv_epi8(
                        _mm_add_epi64(vFL, vOne),
                        _mm_add_epi64(vHL, vOne),
                        cond);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            vHM = _mm_load_si128(pvHMStore + offset);
            vHS = _mm_load_si128(pvHSStore + offset);
            vHL = _mm_load_si128(pvHLStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
                vHM = _mm_slli_si128(vHM, 8);
                vHS = _mm_slli_si128(vHS, 8);
                vHL = _mm_slli_si128(vHL, 8);
            }
            result->stats->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
            result->stats->rowcols->matches_row[j] = (int64_t) _mm_extract_epi64_rpl (vHM, 1);
            result->stats->rowcols->similar_row[j] = (int64_t) _mm_extract_epi64_rpl (vHS, 1);
            result->stats->rowcols->length_row[j] = (int64_t) _mm_extract_epi64_rpl (vHL, 1);
        }
#endif

        {
            __m128i vCompare = _mm_cmpgt_epi64_rpl(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi64_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm_set1_epi64x_rpl(score);
                end_ref = j;
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        __m128i vHM = _mm_load_si128(pvHMStore+i);
        __m128i vHS = _mm_load_si128(pvHSStore+i);
        __m128i vHL = _mm_load_si128(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    if (score == INT64_MAX
            || _mm_movemask_epi8(_mm_cmpeq_epi64(vSaturationCheckMax,vPosLimit))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = 0;
        end_query = 0;
        end_ref = 0;
        matches = 0;
        similar = 0;
        length = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            SWAP(pvHMax,  pvHStore)
            SWAP(pvHMMax, pvHMStore)
            SWAP(pvHSMax, pvHSStore)
            SWAP(pvHLMax, pvHLStore)
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            SWAP(pvHMax,  pvHLoad)
            SWAP(pvHMMax, pvHMLoad)
            SWAP(pvHSMax, pvHSLoad)
            SWAP(pvHLMax, pvHLLoad)
        }
        /* Trace the alignment ending position on read. */
        {
            int64_t *t = (int64_t*)pvHMax;
            int64_t *m = (int64_t*)pvHMMax;
            int64_t *s = (int64_t*)pvHSMax;
            int64_t *l = (int64_t*)pvHLMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len;
            for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                        matches = *m;
                        similar = *s;
                        length = *l;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}